

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option-parser.cc
# Opt level: O3

void __thiscall wabt::OptionParser::Parse(OptionParser *this,int argc,char **argv)

{
  char cVar1;
  ulong uVar2;
  int iVar3;
  pointer pAVar4;
  long lVar5;
  pointer pOVar6;
  pointer pAVar7;
  char *pcVar8;
  bool bVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  char *pcVar13;
  char *pcVar14;
  uint uVar15;
  ulong uVar16;
  int k;
  bool *pbVar17;
  size_t sVar18;
  size_t arg_index;
  size_t local_78;
  char *local_70;
  pointer local_68;
  OptionParser *local_60;
  ulong local_58;
  long local_50;
  long local_48;
  char *local_40;
  long local_38;
  
  local_78 = 0;
  if (argc < 2) {
LAB_0015a344:
    pAVar4 = (this->arguments_).
             super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pAVar7 = (this->arguments_).
             super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (((pAVar4 != pAVar7) && (pAVar7[-1].handled_count == 0)) &&
       (local_78 < (ulong)(((long)pAVar7 - (long)pAVar4 >> 4) * -0x3333333333333333))) {
      lVar5 = local_78 * 0x50 + 0x20;
      sVar18 = local_78;
      do {
        if (*(int *)((long)&(pAVar4->name)._M_dataplus._M_p + lVar5) != 2) {
          Errorf(this,"expected %s argument.",*(undefined8 *)((long)pAVar4 + lVar5 + -0x20));
          pAVar4 = (this->arguments_).
                   super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pAVar7 = (this->arguments_).
                   super__Vector_base<wabt::OptionParser::Argument,_std::allocator<wabt::OptionParser::Argument>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        sVar18 = sVar18 + 1;
        lVar5 = lVar5 + 0x50;
      } while (sVar18 < (ulong)(((long)pAVar7 - (long)pAVar4 >> 4) * -0x3333333333333333));
    }
    return;
  }
  uVar16 = 1;
  bVar9 = true;
  local_60 = this;
LAB_00159fe4:
  pcVar14 = argv[(int)uVar16];
  if ((bVar9) && (*pcVar14 == '-')) {
    cVar1 = pcVar14[1];
    if (cVar1 == '\0') {
      HandleArgument(this,&local_78,pcVar14);
      bVar9 = true;
      goto LAB_0015a13b;
    }
    if (cVar1 == '-') {
      if (pcVar14[2] == '\0') {
        bVar9 = false;
      }
      else {
        pOVar6 = (this->options_).
                 super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar5 = (long)(this->options_).
                      super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar6;
        local_68 = pOVar6;
        if (lVar5 != 0) {
          local_40 = pcVar14 + 2;
          local_38 = (lVar5 >> 4) * -0x71c71c71c71c71c7;
          local_38 = local_38 + (ulong)(local_38 == 0);
          local_50 = local_38 + -1;
          lVar11 = -1;
          lVar5 = 0;
          iVar10 = 0;
          iVar12 = 0;
          local_58 = uVar16;
LAB_0015a089:
          pbVar17 = &pOVar6[lVar5].has_argument;
          uVar16 = local_58;
          local_48 = lVar11;
          do {
            lVar11 = lVar5;
            if (*(size_type *)(pbVar17 + -0x38) != 0) {
              iVar3 = Match(local_40,(string *)(pbVar17 + -0x40),*pbVar17);
              this = local_60;
              uVar16 = local_58;
              if (iVar12 < iVar3) goto LAB_0015a0fc;
              iVar10 = iVar10 + (uint)(iVar3 == iVar12 && 0 < iVar12);
            }
            pbVar17 = pbVar17 + 0x90;
            lVar5 = lVar11 + 1;
            if (local_38 == lVar11 + 1) {
              if (iVar10 < 2) {
                lVar11 = local_48;
                iVar3 = iVar12;
                if (iVar10 == 0) break;
                goto LAB_0015a278;
              }
              Errorf(this,"ambiguous option \'%s\'",pcVar14);
              goto LAB_0015a257;
            }
          } while( true );
        }
        Errorf(this,"unknown option \'%s\'",pcVar14);
        bVar9 = true;
      }
      goto LAB_0015a13b;
    }
    pcVar13 = pcVar14 + 1;
    lVar5 = 1;
    do {
      for (pOVar6 = (this->options_).
                    super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pOVar6 != (this->options_).
                    super__Vector_base<wabt::OptionParser::Option,_std::allocator<wabt::OptionParser::Option>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pOVar6 = pOVar6 + 1) {
        if ((pOVar6->short_name != '\0') && (cVar1 == pOVar6->short_name)) {
          uVar15 = (uint)uVar16;
          if (pOVar6->has_argument == true) {
            if (((pcVar13[1] != '\0') || (uVar15 = uVar15 + 1, uVar15 == argc)) ||
               (pcVar8 = argv[(int)uVar15], *pcVar8 == '-')) {
              Errorf(this,"option \'-%c\' requires argument",(ulong)(uint)(int)cVar1);
              break;
            }
          }
          else {
            pcVar8 = (char *)0x0;
          }
          local_70 = pcVar8;
          if ((pOVar6->callback).super__Function_base._M_manager == (_Manager_type)0x0)
          goto LAB_0015a3d6;
          (*(pOVar6->callback)._M_invoker)((_Any_data *)&pOVar6->callback,&local_70);
          uVar16 = (ulong)uVar15;
          goto LAB_0015a1eb;
        }
      }
      Errorf(this,"unknown option \'-%c\'",(ulong)(uint)(int)*pcVar13);
LAB_0015a1eb:
      pcVar13 = pcVar14 + lVar5 + 1;
      lVar5 = lVar5 + 1;
      cVar1 = *pcVar13;
    } while (cVar1 != '\0');
    goto LAB_0015a257;
  }
  HandleArgument(this,&local_78,pcVar14);
  goto LAB_0015a13b;
LAB_0015a0fc:
  lVar5 = lVar11 + 1;
  iVar10 = 1;
  iVar12 = iVar3;
  if (local_50 == lVar11) goto LAB_0015a278;
  goto LAB_0015a089;
LAB_0015a278:
  iVar12 = (int)lVar11;
  if (local_68[iVar12].has_argument == true) {
    lVar5 = (long)iVar3;
    if ((pcVar14[lVar5 + 1] == '\0') || (pcVar14[lVar5 + 2] != '=')) {
      uVar15 = (int)uVar16 + 1;
      if ((uVar15 == argc) || (pcVar14 = argv[(int)uVar15], uVar2 = (ulong)uVar15, *pcVar14 == '-'))
      {
        Errorf(this,"option \'--%s\' requires argument",local_68[iVar12].long_name._M_dataplus._M_p)
        ;
        goto LAB_0015a257;
      }
    }
    else {
      pcVar14 = pcVar14 + lVar5 + 3;
      uVar2 = uVar16 & 0xffffffff;
    }
  }
  else {
    pcVar14 = (char *)0x0;
    uVar2 = uVar16 & 0xffffffff;
  }
  uVar16 = uVar2;
  local_70 = pcVar14;
  if (local_68[iVar12].callback.super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_0015a3d6:
    std::__throw_bad_function_call();
  }
  (*local_68[iVar12].callback._M_invoker)((_Any_data *)&local_68[iVar12].callback,&local_70);
LAB_0015a257:
  bVar9 = true;
LAB_0015a13b:
  uVar15 = (int)uVar16 + 1;
  uVar16 = (ulong)uVar15;
  if (argc <= (int)uVar15) goto LAB_0015a344;
  goto LAB_00159fe4;
}

Assistant:

void OptionParser::Parse(int argc, char* argv[]) {
  size_t arg_index = 0;
  bool processing_options = true;

  for (int i = 1; i < argc; ++i) {
    const char* arg = argv[i];
    if (!processing_options || arg[0] != '-') {
      // Non-option argument.
      HandleArgument(&arg_index, arg);
      continue;
    }

    if (arg[1] == '-') {
      if (arg[2] == '\0') {
        // -- on its own means stop processing args, everything should
        // be treated as positional.
        processing_options = false;
        continue;
      }
      // Long option.
      int best_index = -1;
      int best_length = 0;
      int best_count = 0;
      for (size_t j = 0; j < options_.size(); ++j) {
        const Option& option = options_[j];
        if (!option.long_name.empty()) {
          int match_length =
              Match(&arg[2], option.long_name, option.has_argument);
          if (match_length > best_length) {
            best_index = j;
            best_length = match_length;
            best_count = 1;
          } else if (match_length == best_length && best_length > 0) {
            best_count++;
          }
        }
      }

      if (best_count > 1) {
        Errorf("ambiguous option '%s'", arg);
        continue;
      } else if (best_count == 0) {
        Errorf("unknown option '%s'", arg);
        continue;
      }

      const Option& best_option = options_[best_index];
      const char* option_argument = nullptr;
      if (best_option.has_argument) {
        if (arg[best_length + 1] != 0 &&    // This byte is 0 on a full match.
            arg[best_length + 2] == '=') {  // +2 to skip "--".
          option_argument = &arg[best_length + 3];
        } else {
          if (i + 1 == argc || argv[i + 1][0] == '-') {
            Errorf("option '--%s' requires argument",
                   best_option.long_name.c_str());
            continue;
          }
          ++i;
          option_argument = argv[i];
        }
      }
      best_option.callback(option_argument);
    } else {
      // Short option.
      if (arg[1] == '\0') {
        // Just "-".
        HandleArgument(&arg_index, arg);
        continue;
      }

      // Allow short names to be combined, e.g. "-d -v" => "-dv".
      for (int k = 1; arg[k]; ++k) {
        bool matched = false;
        for (const Option& option : options_) {
          if (option.short_name && arg[k] == option.short_name) {
            const char* option_argument = nullptr;
            if (option.has_argument) {
              // A short option with a required argument cannot be followed
              // by other short options_.
              if (arg[k + 1] != '\0') {
                Errorf("option '-%c' requires argument", option.short_name);
                break;
              }

              if (i + 1 == argc || argv[i + 1][0] == '-') {
                Errorf("option '-%c' requires argument", option.short_name);
                break;
              }
              ++i;
              option_argument = argv[i];
            }
            option.callback(option_argument);
            matched = true;
            break;
          }
        }

        if (!matched) {
          Errorf("unknown option '-%c'", arg[k]);
          continue;
        }
      }
    }
  }

  // For now, all arguments must be provided. Check that the last Argument was
  // handled at least once.
  if (!arguments_.empty() && arguments_.back().handled_count == 0) {
    for (size_t i = arg_index; i < arguments_.size(); ++i) {
      if (arguments_[i].count != ArgumentCount::ZeroOrMore) {
        Errorf("expected %s argument.", arguments_[i].name.c_str());
      }
    }
  }
}